

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O2

void testReadBadArgs(string *tempdir)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 extraout_RAX;
  char *in_RCX;
  exr_context_t f;
  string fn;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  fn._M_dataplus._M_p = (pointer)&fn.field_2;
  fn._M_string_length = 0;
  fn.field_2._M_local_buf[0] = '\0';
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_18 = 0;
  local_78 = 0x68;
  uStack_20 = 0xbf800000fffffffe;
  local_70 = err_cb;
  exr_set_default_memory_routines(failable_malloc,failable_free);
  std::__cxx11::string::_M_assign((string *)&fn);
  iVar1 = exr_start_read(0,fn._M_dataplus._M_p,0);
  if (iVar1 == 3) {
    uVar2 = exr_start_read(&f,0,0);
    poVar5 = (ostream *)(ulong)uVar2;
    if (uVar2 != 3) goto LAB_0012ad84;
    uVar2 = exr_start_read(&f,0,&local_78);
    poVar5 = (ostream *)(ulong)uVar2;
    if (uVar2 != 3) goto LAB_0012ae22;
    uVar2 = exr_start_read(&f,"",&local_78);
    poVar5 = (ostream *)(ulong)uVar2;
    if (uVar2 != 3) goto LAB_0012aec0;
    uVar2 = exr_start_read(&f,fn._M_dataplus._M_p,&local_78);
    poVar5 = (ostream *)(ulong)uVar2;
    if (uVar2 != 10) goto LAB_0012af5e;
    std::__cxx11::string::append((char *)&fn);
    uVar2 = exr_start_read(&f,fn._M_dataplus._M_p,&local_78);
    poVar5 = (ostream *)(ulong)uVar2;
    if (uVar2 == 5) {
      s_malloc_fail_on = 1;
      uVar2 = exr_start_read(&f,fn._M_dataplus._M_p,&local_78);
      poVar5 = (ostream *)(ulong)uVar2;
      s_malloc_fail_on = 0;
      if (uVar2 == 1) {
        exr_set_default_memory_routines(0,0);
        std::__cxx11::string::~string((string *)&fn);
        return;
      }
      goto LAB_0012b09a;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_start_read (__null, fn.c_str (), __null)",(char *)0x4c,0x156f5e,in_RCX);
LAB_0012ad84:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar3,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_start_read (&f, __null, __null)",(char *)0x4e,0x156f5e,in_RCX);
LAB_0012ae22:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar3,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_start_read (&f, __null, &cinit)",(char *)0x50,0x156f5e,in_RCX);
LAB_0012aec0:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar3,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_start_read (&f, \"\", &cinit)",(char *)0x52,0x156f5e,in_RCX);
LAB_0012af5e:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar3,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,10);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(10);
    poVar3 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x5a,0x156f5e,in_RCX);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
  poVar5 = std::operator<<(poVar3,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n    expected: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,5);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar4 = (char *)exr_get_default_error_message(5);
  poVar3 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x5e,0x156f5e,in_RCX);
LAB_0012b09a:
  poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
  poVar5 = std::operator<<(poVar3,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n    expected: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar4 = (char *)exr_get_default_error_message(1);
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x60,0x156f5e,in_RCX);
  std::__cxx11::string::~string((string *)&fn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}